

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-loader.c++
# Opt level: O2

Maybe<kj::Array<const_unsigned_char>_> * __thiscall
capnp::compiler::ModuleLoader::Impl::readEmbed
          (Maybe<kj::Array<const_unsigned_char>_> *__return_storage_ptr__,Impl *this,
          ReadableDirectory *dir,PathPtr path)

{
  ReadableFile *pRVar1;
  Own<const_kj::ReadableFile,_std::nullptr_t> *file;
  OwnOwn<const_kj::ReadableFile,_std::nullptr_t> _file271;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_78;
  Array<const_unsigned_char> local_68;
  Own<const_kj::ReadableFile,_std::nullptr_t> local_48 [3];
  
  (*(dir->super_FsNode)._vptr_FsNode[10])(local_48,dir,path.parts.ptr,path.parts.size_);
  pRVar1 = local_48[0].ptr;
  local_78.disposer = local_48[0].disposer;
  local_78.ptr = local_48[0].ptr;
  local_48[0].ptr = (ReadableFile *)0x0;
  kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(local_48);
  if (pRVar1 == (ReadableFile *)0x0) {
    kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&local_78);
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    (*(pRVar1->super_FsNode)._vptr_FsNode[2])(local_48,pRVar1);
    (*(pRVar1->super_FsNode)._vptr_FsNode[7])(&local_68,pRVar1,0,local_48[0].ptr);
    (__return_storage_ptr__->ptr).isSet = true;
    (__return_storage_ptr__->ptr).field_1.value.ptr = local_68.ptr;
    (__return_storage_ptr__->ptr).field_1.value.size_ = local_68.size_;
    (__return_storage_ptr__->ptr).field_1.value.disposer = local_68.disposer;
    local_68.ptr = (uchar *)0x0;
    local_68.size_ = 0;
    kj::Array<const_unsigned_char>::~Array(&local_68);
    kj::Own<const_kj::ReadableFile,_std::nullptr_t>::dispose(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<kj::Array<const byte>> ModuleLoader::Impl::readEmbed(
    const kj::ReadableDirectory& dir, kj::PathPtr path) {
  KJ_IF_SOME(file, dir.tryOpenFile(path)) {
    return file->mmap(0, file->stat().size);
  }
  return kj::none;
}